

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

uint64_t __thiscall banksia::ChessBoard::hashKeyEnpassant(ChessBoard *this,int enpassant)

{
  pointer pPVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  if (enpassant < 1) {
    return 0;
  }
  uVar2 = (ulong)(uint)enpassant;
  uVar3 = (*(this->super_BoardCore).super_Obj._vptr_Obj[8])();
  iVar4 = (*(this->super_BoardCore).super_Obj._vptr_Obj[9])(this,uVar2);
  pPVar1 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar4 == 2) {
    if (0 < (int)uVar3) {
      if ((pPVar1[uVar2 + 7].type == pawn) && (pPVar1[uVar2 + 7].side == white)) goto LAB_0017ed2a;
      if (6 < uVar3) {
        return 0;
      }
    }
    if (pPVar1[uVar2 + 9].type != pawn) {
      return 0;
    }
    if (pPVar1[uVar2 + 9].side != white) {
      return 0;
    }
  }
  else {
    if (0 < (int)uVar3) {
      if ((pPVar1[uVar2 - 9].type == pawn) && (pPVar1[uVar2 - 9].side == black)) goto LAB_0017ed2a;
      if (6 < uVar3) {
        return 0;
      }
    }
    if (pPVar1[uVar2 - 7].type != pawn) {
      return 0;
    }
    if (pPVar1[uVar2 - 7].side != black) {
      return 0;
    }
  }
LAB_0017ed2a:
  return RandomEnPassant[(int)uVar3];
}

Assistant:

u64 ChessBoard::hashKeyEnpassant(int enpassant) const
{
    u64 key = 0;
    
    if (enpassant > 0) {
        
        auto col = getColumn(enpassant), row = getRow(enpassant);
        auto ok = false;
        if (row == 2) {
            ok = (col > 0 && isPiece(enpassant + 7, PieceType::pawn, Side::white))
            || (col < 7 && isPiece(enpassant + 9, PieceType::pawn, Side::white));
        } else {
            ok = (col > 0 && isPiece(enpassant - 9, PieceType::pawn, Side::black))
            || (col < 7 && isPiece(enpassant - 7, PieceType::pawn, Side::black));
        }
        if (ok) key ^= RandomEnPassant[col];
    }
    
    return key;
}